

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::cmGraphVizWriter(cmGraphVizWriter *this,cmGlobalGenerator *globalGenerator)

{
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar1;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  cmGlobalGenerator *local_18;
  cmGlobalGenerator *globalGenerator_local;
  cmGraphVizWriter *this_local;
  
  local_18 = globalGenerator;
  globalGenerator_local = (cmGlobalGenerator *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"digraph",&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->GraphName,"GG",local_2d);
  std::allocator<char>::~allocator(local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->GraphHeader,"node [\n  fontsize = \"12\"\n];",&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->GraphNodePrefix,"node",&local_2f);
  std::allocator<char>::~allocator(&local_2f);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&this->TargetsToIgnoreRegex);
  this->GlobalGenerator = local_18;
  pvVar1 = cmGlobalGenerator::GetLocalGenerators(local_18);
  this->LocalGenerators = pvVar1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
  ::map(&this->TargetPtrs);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->TargetNamesNodes);
  this->GenerateForExecutables = true;
  this->GenerateForStaticLibs = true;
  this->GenerateForSharedLibs = true;
  this->GenerateForModuleLibs = true;
  this->GenerateForInterface = true;
  this->GenerateForExternals = true;
  this->GeneratePerTarget = true;
  this->GenerateDependers = true;
  this->HaveTargetsAndLibs = false;
  return;
}

Assistant:

cmGraphVizWriter::cmGraphVizWriter(const cmGlobalGenerator* globalGenerator)
  : GraphType("digraph")
  , GraphName("GG")
  , GraphHeader("node [\n  fontsize = \"12\"\n];")
  , GraphNodePrefix("node")
  , GlobalGenerator(globalGenerator)
  , LocalGenerators(globalGenerator->GetLocalGenerators())
  , GenerateForExecutables(true)
  , GenerateForStaticLibs(true)
  , GenerateForSharedLibs(true)
  , GenerateForModuleLibs(true)
  , GenerateForInterface(true)
  , GenerateForExternals(true)
  , GeneratePerTarget(true)
  , GenerateDependers(true)
  , HaveTargetsAndLibs(false)
{
}